

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.h
# Opt level: O1

Node * __thiscall
leveldb::SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::FindLessThan
          (SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *this,char **key)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  Node *pNVar4;
  Node *pNVar5;
  Node *unaff_R15;
  
  uVar3 = (this->max_height_).super___atomic_base<int>._M_i - 1;
  pNVar4 = this->head_;
  do {
    if (pNVar4 != this->head_) {
      iVar2 = MemTable::KeyComparator::operator()(&this->compare_,pNVar4->key,*key);
      if (-1 < iVar2) {
        __assert_fail("x == head_ || compare_(x->key, key) < 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/skiplist.h"
                      ,0x121,
                      "typename SkipList<Key, Comparator>::Node *leveldb::SkipList<const char *, leveldb::MemTable::KeyComparator>::FindLessThan(const Key &) const [Key = const char *, Comparator = leveldb::MemTable::KeyComparator]"
                     );
      }
    }
    if ((int)uVar3 < 0) {
      __assert_fail("n >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/skiplist.h"
                    ,0x9a,
                    "Node *leveldb::SkipList<const char *, leveldb::MemTable::KeyComparator>::Node::Next(int) [Key = const char *, Comparator = leveldb::MemTable::KeyComparator]"
                   );
    }
    pNVar5 = pNVar4->next_[uVar3]._M_b._M_p;
    if (pNVar5 == (Node *)0x0) {
LAB_00112ffe:
      pNVar5 = pNVar4;
      if (uVar3 == 0) {
        uVar3 = 0;
        bVar1 = false;
        unaff_R15 = pNVar4;
      }
      else {
        uVar3 = uVar3 - 1;
        bVar1 = true;
      }
    }
    else {
      iVar2 = MemTable::KeyComparator::operator()(&this->compare_,pNVar5->key,*key);
      if (-1 < iVar2) goto LAB_00112ffe;
      bVar1 = true;
    }
    pNVar4 = pNVar5;
    if (!bVar1) {
      return unaff_R15;
    }
  } while( true );
}

Assistant:

typename SkipList<Key, Comparator>::Node*
SkipList<Key, Comparator>::FindLessThan(const Key& key) const {
  Node* x = head_;
  int level = GetMaxHeight() - 1;
  while (true) {
    assert(x == head_ || compare_(x->key, key) < 0);
    Node* next = x->Next(level);
    if (next == nullptr || compare_(next->key, key) >= 0) {
      if (level == 0) {
        return x;
      } else {
        // Switch to next list
        level--;
      }
    } else {
      x = next;
    }
  }
}